

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

char * SimpleString::copyToNewBuffer(char *bufferToCopy,size_t bufferSize)

{
  char *s1;
  size_t in_RSI;
  char *in_RDI;
  char *newBuffer;
  char *in_stack_ffffffffffffffe8;
  
  s1 = allocStringBuffer(in_RSI,in_stack_ffffffffffffffe8,0x171154);
  StrNCpy(s1,in_RDI,in_RSI);
  s1[in_RSI - 1] = '\0';
  return s1;
}

Assistant:

char* SimpleString::copyToNewBuffer(const char* bufferToCopy, size_t bufferSize)
{
    char* newBuffer = allocStringBuffer(bufferSize, __FILE__, __LINE__);
    StrNCpy(newBuffer, bufferToCopy, bufferSize);
    newBuffer[bufferSize-1] = '\0';
    return newBuffer;
}